

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borromean_impl.h
# Opt level: O3

int secp256k1_borromean_sign
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_ecmult_gen_context *ecmult_gen_ctx,
              uchar *e0,secp256k1_scalar *s,secp256k1_gej *pubs,secp256k1_scalar *k,
              secp256k1_scalar *sec,size_t *rsizes,size_t *secidx,size_t nrings,uchar *m,size_t mlen
              )

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  secp256k1_gej *psVar6;
  uchar *data;
  secp256k1_scalar *psVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  size_t size;
  secp256k1_scalar ens;
  uchar tmp [33];
  secp256k1_gej rgej;
  secp256k1_ge rge;
  secp256k1_strauss_point_state ps [1];
  uint32_t epos;
  secp256k1_fe zr [8];
  uint32_t ring;
  int local_e70;
  uint local_e6c;
  size_t local_e68;
  secp256k1_scalar *local_e60;
  long local_e58;
  ulong local_e50;
  secp256k1_gej *local_e48;
  size_t local_e40;
  uchar *local_e38;
  secp256k1_scalar *local_e30;
  secp256k1_ecmult_context *local_e28;
  secp256k1_strauss_state local_e20;
  secp256k1_scalar *local_e00;
  secp256k1_gej *local_df8;
  secp256k1_gej *local_df0;
  secp256k1_scalar *local_de8;
  secp256k1_ecmult_gen_context *local_de0;
  secp256k1_scalar local_dd8;
  uchar local_db8 [48];
  secp256k1_sha256 local_d88;
  secp256k1_gej local_d20;
  secp256k1_ge local_ca0;
  secp256k1_strauss_point_state local_c48;
  secp256k1_ge local_838 [8];
  secp256k1_fe local_578 [8];
  secp256k1_gej local_438 [8];
  
  local_d88.s[0] = 0x6a09e667;
  local_d88.s[1] = 0xbb67ae85;
  local_d88.s[2] = 0x3c6ef372;
  local_d88.s[3] = 0xa54ff53a;
  local_d88.s[4] = 0x510e527f;
  local_d88.s[5] = 0x9b05688c;
  local_d88.s[6] = 0x1f83d9ab;
  local_d88.s[7] = 0x5be0cd19;
  local_d88.bytes = 0;
  local_e30 = k;
  local_e28 = ecmult_ctx;
  local_de0 = ecmult_gen_ctx;
  if (nrings == 0) {
    secp256k1_sha256_write(&local_d88,m,mlen);
    secp256k1_sha256_finalize(&local_d88,e0);
  }
  else {
    local_de8 = s + 1;
    local_df0 = pubs + 1;
    local_e58 = 0;
    sVar8 = 0;
    local_e38 = e0;
    local_e00 = s;
    local_df8 = pubs;
    do {
      secp256k1_ecmult_gen(local_de0,&local_d20,local_e30 + sVar8);
      secp256k1_ge_set_gej(&local_ca0,&local_d20);
      if (local_d20.infinity != 0) {
        return 0;
      }
      secp256k1_eckey_pubkey_serialize(&local_ca0,local_db8,&local_e40,1);
      uVar4 = secidx[sVar8] + 1;
      if (uVar4 < rsizes[sVar8]) {
        uVar2 = (uint)sVar8;
        local_e6c = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        lVar5 = secidx[sVar8] + local_e58;
        local_e60 = local_de8 + lVar5;
        psVar6 = local_df0 + lVar5;
        local_e68 = sVar8;
        do {
          local_c48.wnaf_na[0] = 0x6a09e667;
          local_c48.wnaf_na[1] = -0x4498517b;
          local_c48.wnaf_na[2] = 0x3c6ef372;
          local_c48.wnaf_na[3] = -0x5ab00ac6;
          local_c48.wnaf_na[4] = 0x510e527f;
          local_c48.wnaf_na[5] = -0x64fa9774;
          local_c48.wnaf_na[6] = 0x1f83d9ab;
          local_c48.wnaf_na[7] = 0x5be0cd19;
          local_c48.wnaf_na[0x18] = 0;
          local_c48.wnaf_na[0x19] = 0;
          local_438[0].x.n[0]._0_4_ = local_e6c;
          uVar2 = (uint)uVar4;
          local_838[0].x.n[0]._0_4_ =
               uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
          local_e50 = uVar4;
          local_e48 = psVar6;
          secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,local_db8,0x21);
          secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,m,mlen);
          secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,(uchar *)local_438,4);
          secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,(uchar *)local_838,4);
          secp256k1_sha256_finalize((secp256k1_sha256 *)&local_c48,local_db8);
          secp256k1_scalar_set_b32(&local_dd8,local_db8,&local_e70);
          psVar6 = local_e48;
          psVar7 = local_e60;
          if (local_e70 != 0) {
            return 0;
          }
          if ((local_dd8.d[3] == 0 && local_dd8.d[1] == 0) &&
              (local_dd8.d[2] == 0 && local_dd8.d[0] == 0)) {
            return 0;
          }
          local_e20.zr = local_578;
          local_e20.ps = &local_c48;
          local_e20.prej = local_438;
          local_e20.pre_a = local_838;
          secp256k1_ecmult_strauss_wnaf
                    (local_e28,&local_e20,&local_d20,1,local_e48,&local_dd8,local_e60);
          if (local_d20.infinity != 0) {
            return 0;
          }
          secp256k1_ge_set_gej_var(&local_ca0,&local_d20);
          secp256k1_eckey_pubkey_serialize(&local_ca0,local_db8,&local_e40,1);
          uVar4 = local_e50 + 1;
          local_e60 = psVar7 + 1;
          psVar6 = psVar6 + 1;
          sVar8 = local_e68;
        } while (uVar4 < rsizes[local_e68]);
      }
      secp256k1_sha256_write(&local_d88,local_db8,local_e40);
      local_e58 = local_e58 + rsizes[sVar8];
      sVar8 = sVar8 + 1;
    } while (sVar8 != nrings);
    secp256k1_sha256_write(&local_d88,m,mlen);
    data = local_e38;
    secp256k1_sha256_finalize(&local_d88,local_e38);
    local_e68 = 0;
    local_e50 = 0;
    do {
      local_c48.wnaf_na[0] = 0x6a09e667;
      local_c48.wnaf_na[1] = -0x4498517b;
      local_c48.wnaf_na[2] = 0x3c6ef372;
      local_c48.wnaf_na[3] = -0x5ab00ac6;
      local_c48.wnaf_na[4] = 0x510e527f;
      local_c48.wnaf_na[5] = -0x64fa9774;
      local_c48.wnaf_na[6] = 0x1f83d9ab;
      local_c48.wnaf_na[7] = 0x5be0cd19;
      local_c48.wnaf_na[0x18] = 0;
      local_c48.wnaf_na[0x19] = 0;
      uVar2 = (uint)local_e50;
      local_e6c = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      local_838[0].x.n[0]._0_4_ = 0;
      local_438[0].x.n[0]._0_4_ = local_e6c;
      secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,data,0x20);
      secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,m,mlen);
      secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,(uchar *)local_438,4);
      secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,(uchar *)local_838,4);
      secp256k1_sha256_finalize((secp256k1_sha256 *)&local_c48,local_db8);
      secp256k1_scalar_set_b32(&local_dd8,local_db8,&local_e70);
      if ((local_e70 != 0) ||
         ((local_dd8.d[3] == 0 && local_dd8.d[1] == 0) &&
          (local_dd8.d[2] == 0 && local_dd8.d[0] == 0))) {
        return 0;
      }
      psVar7 = local_e00 + local_e68;
      psVar6 = local_df8 + local_e68;
      uVar4 = 0;
      while (uVar1 = local_e50, uVar4 < secidx[local_e50]) {
        local_e20.zr = local_578;
        local_e20.ps = &local_c48;
        local_e60 = psVar7;
        local_e48 = psVar6;
        local_e20.prej = local_438;
        local_e20.pre_a = local_838;
        secp256k1_ecmult_strauss_wnaf(local_e28,&local_e20,&local_d20,1,psVar6,&local_dd8,psVar7);
        if (local_d20.infinity != 0) {
          return 0;
        }
        secp256k1_ge_set_gej_var(&local_ca0,&local_d20);
        secp256k1_eckey_pubkey_serialize(&local_ca0,local_db8,&local_e40,1);
        uVar4 = uVar4 + 1;
        local_c48.wnaf_na[0] = 0x6a09e667;
        local_c48.wnaf_na[1] = -0x4498517b;
        local_c48.wnaf_na[2] = 0x3c6ef372;
        local_c48.wnaf_na[3] = -0x5ab00ac6;
        local_c48.wnaf_na[4] = 0x510e527f;
        local_c48.wnaf_na[5] = -0x64fa9774;
        local_c48.wnaf_na[6] = 0x1f83d9ab;
        local_c48.wnaf_na[7] = 0x5be0cd19;
        local_c48.wnaf_na[0x18] = 0;
        local_c48.wnaf_na[0x19] = 0;
        local_438[0].x.n[0]._0_4_ = local_e6c;
        uVar2 = (uint)uVar4;
        local_838[0].x.n[0]._0_4_ =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,local_db8,0x21);
        secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,m,mlen);
        secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,(uchar *)local_438,4);
        secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,(uchar *)local_838,4);
        secp256k1_sha256_finalize((secp256k1_sha256 *)&local_c48,local_db8);
        secp256k1_scalar_set_b32(&local_dd8,local_db8,&local_e70);
        if (local_e70 != 0) {
          return 0;
        }
        psVar7 = local_e60 + 1;
        psVar6 = local_e48 + 1;
        if ((local_dd8.d[3] == 0 && local_dd8.d[1] == 0) &&
            (local_dd8.d[2] == 0 && local_dd8.d[0] == 0)) {
          return 0;
        }
      }
      secp256k1_scalar_mul(psVar7,&local_dd8,sec + local_e50);
      secp256k1_scalar_negate(psVar7,psVar7);
      iVar3 = secp256k1_scalar_add(psVar7,psVar7,local_e30 + uVar1);
      auVar9._0_4_ = -(uint)((int)psVar7->d[2] == 0 && (int)psVar7->d[0] == 0);
      auVar9._4_4_ = -(uint)(*(int *)((long)psVar7->d + 0x14) == 0 &&
                            *(int *)((long)psVar7->d + 4) == 0);
      auVar9._8_4_ = -(uint)((int)psVar7->d[3] == 0 && (int)psVar7->d[1] == 0);
      auVar9._12_4_ =
           -(uint)(*(int *)((long)psVar7->d + 0x1c) == 0 && *(int *)((long)psVar7->d + 0xc) == 0);
      iVar3 = movmskps(iVar3,auVar9);
      if (iVar3 == 0xf) {
        return 0;
      }
      local_e68 = local_e68 + rsizes[uVar1];
      local_e50 = uVar1 + 1;
      data = local_e38;
    } while (local_e50 != nrings);
  }
  return 1;
}

Assistant:

int secp256k1_borromean_sign(const secp256k1_ecmult_context* ecmult_ctx, const secp256k1_ecmult_gen_context *ecmult_gen_ctx,
 unsigned char *e0, secp256k1_scalar *s, const secp256k1_gej *pubs, const secp256k1_scalar *k, const secp256k1_scalar *sec,
 const size_t *rsizes, const size_t *secidx, size_t nrings, const unsigned char *m, size_t mlen) {
    secp256k1_gej rgej;
    secp256k1_ge rge;
    secp256k1_scalar ens;
    secp256k1_sha256 sha256_e0;
    unsigned char tmp[33];
    size_t i;
    size_t j;
    size_t count;
    size_t size;
    int overflow;
    VERIFY_CHECK(ecmult_ctx != NULL);
    VERIFY_CHECK(ecmult_gen_ctx != NULL);
    VERIFY_CHECK(e0 != NULL);
    VERIFY_CHECK(s != NULL);
    VERIFY_CHECK(pubs != NULL);
    VERIFY_CHECK(k != NULL);
    VERIFY_CHECK(sec != NULL);
    VERIFY_CHECK(rsizes != NULL);
    VERIFY_CHECK(secidx != NULL);
    VERIFY_CHECK(nrings > 0);
    VERIFY_CHECK(m != NULL);
    secp256k1_sha256_initialize(&sha256_e0);
    count = 0;
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_ecmult_gen(ecmult_gen_ctx, &rgej, &k[i]);
        secp256k1_ge_set_gej(&rge, &rgej);
        if (secp256k1_gej_is_infinity(&rgej)) {
            return 0;
        }
        secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
        for (j = secidx[i] + 1; j < rsizes[i]; j++) {
            secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j);
            secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ens)) {
                return 0;
            }
            /** The signing algorithm as a whole is not memory uniform so there is likely a cache sidechannel that
             *  leaks which members are non-forgeries. That the forgeries themselves are variable time may leave
             *  an additional privacy impacting timing side-channel, but not a key loss one.
             */
            secp256k1_ecmult(ecmult_ctx, &rgej, &pubs[count + j], &ens, &s[count + j]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
        }
        secp256k1_sha256_write(&sha256_e0, tmp, size);
        count += rsizes[i];
    }
    secp256k1_sha256_write(&sha256_e0, m, mlen);
    secp256k1_sha256_finalize(&sha256_e0, e0);
    count = 0;
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_borromean_hash(tmp, m, mlen, e0, 32, i, 0);
        secp256k1_scalar_set_b32(&ens, tmp, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ens)) {
            return 0;
        }
        for (j = 0; j < secidx[i]; j++) {
            secp256k1_ecmult(ecmult_ctx, &rgej, &pubs[count + j], &ens, &s[count + j]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
            secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j + 1);
            secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ens)) {
                return 0;
            }
        }
        secp256k1_scalar_mul(&s[count + j], &ens, &sec[i]);
        secp256k1_scalar_negate(&s[count + j], &s[count + j]);
        secp256k1_scalar_add(&s[count + j], &s[count + j], &k[i]);
        if (secp256k1_scalar_is_zero(&s[count + j])) {
            return 0;
        }
        count += rsizes[i];
    }
    secp256k1_scalar_clear(&ens);
    secp256k1_ge_clear(&rge);
    secp256k1_gej_clear(&rgej);
    memset(tmp, 0, 33);
    return 1;
}